

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O2

void test_2d_dynamic<1ul,5ul,1ul,30ul>(void)

{
  reference pvVar1;
  pointer t;
  size_type sVar2;
  pointer t_00;
  int *local_60;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  pointer local_38;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x10d,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x10f,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x110,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,(int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x112,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x113,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x119,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11b,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11c,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x6;
  true_idx = 6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11e,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11f,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,0x1e,(value_type_conflict1 *)&true_idx,(allocator_type *)&local_60);
  t_00 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  t = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  for (sVar2 = 0; sVar2 != 0x1e; sVar2 = sVar2 + 5) {
    local_60 = (int *)sVar2;
    true_idx = sVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,300,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_60,&true_idx);
    local_38 = t_00 + true_idx;
    local_60 = t;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x12e,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",&local_60,
               &local_38);
    *t = 0x11;
    local_60._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x132,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",t,
               (int *)&local_60);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,sVar2);
    local_60 = (int *)CONCAT44(local_60._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(sub_l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x135,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
               (int *)&local_60);
    t = t + 5;
  }
  sVar2 = 0;
  while( true ) {
    if (sVar2 == 0x1e) break;
    local_60 = (int *)sVar2;
    true_idx = sVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x13e,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_60,&true_idx);
    if ((sVar2 / 5) * 5 == sVar2) {
      local_60._0_4_ = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x145,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",t_00,
                 (int *)&local_60);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,sVar2);
      local_60 = (int *)CONCAT44(local_60._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x148,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_60);
    }
    else {
      local_60._0_4_ = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x14d,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",t_00,
                 (int *)&local_60);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(&data,sVar2);
      local_60 = (int *)CONCAT44(local_60._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x150,"void test_2d_dynamic() [N = 1UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar1,
                 (int *)&local_60);
    }
    sVar2 = sVar2 + 1;
    t_00 = t_00 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0>
    > const l{{X, Y}, {1, 1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0> 
    > const sub_l{{X / N, Y / M}, {N, M}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    // Initialize all elements to 42.
    std::vector<int> data(l[0] * l[1], 42);
    int* dptr = data.data();

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
        }
    }
}